

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

Am_Value compute_mg_start_when_proc(Am_Object *self)

{
  ushort uVar1;
  bool bVar2;
  Am_Value *value;
  Am_Wrapper *initial;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar3;
  Am_Input_Char local_60;
  undefined4 local_5c;
  Am_Value local_58;
  Am_Input_Char local_44;
  undefined1 local_40 [8];
  Am_Value_List char_list;
  Am_Input_Char parent_char;
  Am_Object local_20;
  Am_Object widget;
  Am_Object *self_local;
  
  Am_Object::Get_Owner(&local_20,in_RSI);
  bVar2 = Am_Object::Valid(&local_20);
  if (bVar2) {
    Am_Input_Char::Am_Input_Char
              ((Am_Input_Char *)&char_list.item,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    get_owner_start_and_convert_string((Am_Object *)local_40);
    Am_Value_List::Start((Am_Value_List *)local_40);
    while( true ) {
      bVar2 = Am_Value_List::Last((Am_Value_List *)local_40);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      value = Am_Value_List::Get((Am_Value_List *)local_40);
      Am_Input_Char::Am_Input_Char(&local_44,value);
      Am_Input_Char::operator=((Am_Input_Char *)&char_list.item,&local_44);
      uVar1 = char_list.item._2_2_ & 0xfff6;
      if ((char_list.item._2_2_ >> 4 & 0xf) == 3) {
        uVar1 = char_list.item._2_2_ & 0xff06 | 0x10;
      }
      char_list.item._2_2_ = uVar1;
      if ((char_list.item._2_2_ >> 8 & 0xf) == 7) {
        char_list.item._2_2_ = char_list.item._2_2_ & 0xf0ff | 0x100;
      }
      Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_58);
      Am_Value_List::Set((Am_Value_List *)local_40,&local_58,true);
      Am_Value::~Am_Value(&local_58);
      Am_Value_List::Next((Am_Value_List *)local_40);
    }
    initial = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_40);
    Am_Value::Am_Value((Am_Value *)self,initial);
    local_5c = 1;
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_40);
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_60,"LEFT_DOWN",true);
    Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)self);
    local_5c = 1;
  }
  Am_Object::~Am_Object(&local_20);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, compute_mg_start_when)
{
  Am_Object widget = self.Get_Owner();
  if (widget.Valid()) {
    Am_Input_Char parent_char;
    Am_Value_List char_list = get_owner_start_and_convert_string(widget);
    for (char_list.Start(); !char_list.Last(); char_list.Next()) {
      parent_char = (Am_Input_Char)char_list.Get();
      parent_char.any_modifier = false;
      parent_char.shift = false;
      if (parent_char.button_down == Am_ANY_DOWN_UP)
        parent_char.button_down = Am_BUTTON_DOWN;
      if (parent_char.click_count == Am_ANY_CLICK)
        parent_char.click_count = Am_SINGLE_CLICK;
      //std::cout << "computed start when " << parent_char << " from widget " <<
      //  widget <<std::endl <<std::flush;
      char_list.Set(parent_char);
    }
    return Am_Value(char_list);
  } else
    return Am_Input_Char("LEFT_DOWN");
}